

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O1

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::FindInitFaceConfiguration
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *this,
          FaceIndex face_id,CornerIndex *out_corner)

{
  uint uVar1;
  CornerTable *pCVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar3 = face_id.value_ * 3;
  pCVar2 = (this->corner_table_)._M_t.
           super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>._M_t.
           super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
           super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
  bVar6 = false;
  uVar4 = 0;
  do {
    if ((uVar3 == 0xffffffff) ||
       (*(int *)(*(long *)&(pCVar2->opposite_corners_).vector_.
                           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                + (ulong)uVar3 * 4) == -1)) break;
    if (uVar3 == 0xffffffff) {
      uVar5 = 0xffffffff;
    }
    else {
      uVar5 = (ulong)*(uint *)(*(long *)&(pCVar2->corner_to_vertex_map_).vector_ + (ulong)uVar3 * 4)
      ;
    }
    if ((this->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5] != -1) goto LAB_0013c065;
    if (uVar3 != 0xffffffff) {
      uVar1 = uVar3 + 1;
      uVar3 = uVar3 - 2;
      if (0x55555555 < uVar1 * -0x55555555) {
        uVar3 = uVar1;
      }
    }
    bVar6 = 1 < uVar4;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 3);
LAB_0013c0d4:
  out_corner->value_ = uVar3;
  return bVar6;
LAB_0013c065:
  do {
    uVar4 = uVar3;
    uVar3 = ((uVar4 * -0x55555555 < 0x55555556) - 1 | 2) + uVar4;
    if (uVar3 != 0xffffffff) {
      uVar3 = *(uint *)(*(long *)&(pCVar2->opposite_corners_).vector_.
                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       + (ulong)uVar3 * 4);
    }
    if (uVar3 != 0xffffffff) {
      uVar3 = uVar3 + ((uVar3 * -0x55555555 < 0x55555556) - 1 | 2);
    }
  } while (uVar3 != 0xffffffff);
  if (uVar4 == 0xffffffff) {
    uVar3 = 0xffffffff;
  }
  else {
    uVar3 = ((uVar4 * -0x55555555 < 0x55555556) - 1 | 2) + uVar4;
  }
  goto LAB_0013c0d4;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::FindInitFaceConfiguration(
    FaceIndex face_id, CornerIndex *out_corner) const {
  CornerIndex corner_index = CornerIndex(3 * face_id.value());
  for (int i = 0; i < 3; ++i) {
    if (corner_table_->Opposite(corner_index) == kInvalidCornerIndex) {
      // If there is a boundary edge, the configuration is exterior and return
      // the CornerIndex opposite to the first boundary edge.
      *out_corner = corner_index;
      return false;
    }
    if (vertex_hole_id_[corner_table_->Vertex(corner_index).value()] != -1) {
      // Boundary vertex found. Find the first boundary edge attached to the
      // point and return the corner opposite to it.
      CornerIndex right_corner = corner_index;
      while (right_corner != kInvalidCornerIndex) {
        corner_index = right_corner;
        right_corner = corner_table_->SwingRight(right_corner);
      }
      // |corner_index| now lies on a boundary edge and its previous corner is
      // guaranteed to be the opposite corner of the boundary edge.
      *out_corner = corner_table_->Previous(corner_index);
      return false;
    }
    corner_index = corner_table_->Next(corner_index);
  }
  // Else we have an interior configuration. Return the first corner id.
  *out_corner = corner_index;
  return true;
}